

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nested_functions.cpp
# Opt level: O3

void duckdb::MapUtil::ReinterpretMap(Vector *result,Vector *input,idx_t count)

{
  VectorType vector_type_p;
  Vector *pVVar1;
  idx_t size;
  Vector *pVVar2;
  UnifiedVectorFormat input_struct_data;
  UnifiedVectorFormat input_data;
  UnifiedVectorFormat UStack_b8;
  UnifiedVectorFormat local_70;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&local_70);
  Vector::ToUnifiedFormat(input,count,&local_70);
  FlatVector::VerifyFlatVector(result);
  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
       local_70.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask;
  shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
            (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
             &local_70.validity.super_TemplatedValidityMask<unsigned_long>.validity_data);
  (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
       local_70.validity.super_TemplatedValidityMask<unsigned_long>.capacity;
  UnifiedVectorFormat::UnifiedVectorFormat(&UStack_b8);
  pVVar1 = ListVector::GetEntry(input);
  Vector::ToUnifiedFormat(pVVar1,count,&UStack_b8);
  pVVar1 = ListVector::GetEntry(result);
  FlatVector::VerifyFlatVector(pVVar1);
  (pVVar1->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
       UStack_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask;
  shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
            (&(pVVar1->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
             &UStack_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data);
  (pVVar1->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
       UStack_b8.validity.super_TemplatedValidityMask<unsigned_long>.capacity;
  size = ListVector::GetListSize(input);
  ListVector::SetListSize(result,size);
  shared_ptr<duckdb::VectorBuffer,_true>::operator=(&result->buffer,&input->buffer);
  result->data = input->data;
  pVVar1 = MapVector::GetKeys(input);
  pVVar2 = MapVector::GetKeys(result);
  Vector::Reference(pVVar2,pVVar1);
  pVVar1 = MapVector::GetValues(input);
  pVVar2 = MapVector::GetValues(result);
  Vector::Reference(pVVar2,pVVar1);
  vector_type_p = input->vector_type;
  if (vector_type_p == DICTIONARY_VECTOR) {
    Vector::Slice(result,local_70.sel,count);
    vector_type_p = input->vector_type;
  }
  Vector::SetVectorType(result,vector_type_p);
  if (UStack_b8.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (UStack_b8.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (UStack_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (UStack_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_70.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_70.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void MapUtil::ReinterpretMap(Vector &result, Vector &input, idx_t count) {
	UnifiedVectorFormat input_data;
	input.ToUnifiedFormat(count, input_data);
	// Copy the list validity
	FlatVector::SetValidity(result, input_data.validity);

	// Copy the struct validity
	UnifiedVectorFormat input_struct_data;
	ListVector::GetEntry(input).ToUnifiedFormat(count, input_struct_data);
	auto &result_struct = ListVector::GetEntry(result);
	FlatVector::SetValidity(result_struct, input_struct_data.validity);

	// Copy the list size
	auto list_size = ListVector::GetListSize(input);
	ListVector::SetListSize(result, list_size);

	// Copy the list buffer (the list_entry_t data)
	result.CopyBuffer(input);

	auto &input_keys = MapVector::GetKeys(input);
	auto &result_keys = MapVector::GetKeys(result);
	result_keys.Reference(input_keys);

	auto &input_values = MapVector::GetValues(input);
	auto &result_values = MapVector::GetValues(result);
	result_values.Reference(input_values);

	if (input.GetVectorType() == VectorType::DICTIONARY_VECTOR) {
		result.Slice(*input_data.sel, count);
	}

	// Set the right vector type
	result.SetVectorType(input.GetVectorType());
}